

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(uchar lhs,SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *result_00;
  uchar ret;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  uchar local_1d;
  char local_1c [2];
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_1a;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_19;
  
  result_00 = &local_1a;
  local_1a.m_int = '\0';
  local_1d = lhs;
  bVar1 = DivisionCornerCaseHelper<char,_unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
          ::DivisionCornerCase1(lhs,rhs,result_00);
  if (!bVar1) {
    local_1c[1] = 0;
    local_1c[0] = rhs.m_int;
    DivisionHelper<unsigned_char,_char,_1>::
    DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              (&local_1d,local_1c,(uchar *)(local_1c + 1));
    result_00 = &local_19;
    SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<unsigned_char>
              (result_00,(uchar *)(local_1c + 1));
  }
  return (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)result_00->m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}